

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Reg2Aux
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint byteOffset,int C1)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  uint local_48;
  RegSlot local_44;
  OpLayoutReg2Aux data;
  
  data.R1 = (RegSlot)CONCAT62(in_register_00000032,op);
  data.super_OpLayoutAuxiliary.R0 = C1;
  CheckOpen(this);
  RVar3 = ConsumeReg(this,R0);
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.C1 = ConsumeReg(this,R1);
  if ((this->m_auxiliaryData).currentOffset <= byteOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa30,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                "byteOffset < m_auxiliaryData.GetCurrentOffset()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_44 = data.super_OpLayoutAuxiliary.R0;
  local_48 = byteOffset;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.Offset = RVar3;
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,(OpCode)data.R1,&local_48,0x10,this);
  return;
}

Assistant:

void ByteCodeWriter::Reg2Aux(OpCode op, RegSlot R0, RegSlot R1, uint byteOffset, int C1)
    {
        CheckOpen();
        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutReg2Aux data;
        data.R0 = R0;
        data.R1 = R1;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }